

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

void device_reset_nes_nsfplay(void *chip)

{
  NESAPU_INF *info;
  void *chip_local;
  
  NES_APU_np_Reset(*(void **)((long)chip + 8));
  NES_DMC_np_Reset(*(void **)((long)chip + 0x10));
  if (*(long *)((long)chip + 0x18) != 0) {
    NES_FDS_Reset(*(void **)((long)chip + 0x18));
  }
  return;
}

Assistant:

static void device_reset_nes_nsfplay(void* chip)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	NES_APU_np_Reset(info->chip_apu);
	NES_DMC_np_Reset(info->chip_dmc);
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		NES_FDS_Reset(info->chip_fds);
#endif
	
	return;
}